

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

int reader(UI *ui,UI_STRING *uis)

{
  int extraout_EAX;
  
  write_section("banner");
  create_symbol_table();
  read_declarations();
  read_grammar();
  if (read_errs != 0) {
    done(1);
  }
  free_symbol_table();
  pack_names();
  check_symbols();
  pack_symbols();
  gen_yydestruct();
  free_destructors();
  free_tags();
  pack_grammar();
  free_symbols();
  print_grammar_ebnf();
  print_grammar();
  return extraout_EAX;
}

Assistant:

void reader() {
  write_section("banner");
  create_symbol_table();
  read_declarations();
  read_grammar();
  if(read_errs) done(1);
  free_symbol_table();
  pack_names();
  check_symbols();
  pack_symbols();
  gen_yydestruct();
  free_destructors();
  free_tags();
  pack_grammar();
  free_symbols();
  print_grammar_ebnf();
  print_grammar();
}